

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateArray(ExpressionTranslateContext *ctx,ExprArray *expression)

{
  ExprBase *expression_00;
  IntrusiveList<ExprBase> *pIVar1;
  ulong uVar2;
  
  TranslateTypeName(ctx,(expression->super_ExprBase).type);
  Print(ctx,"()");
  uVar2 = 0;
  pIVar1 = &expression->values;
  while (expression_00 = pIVar1->head, expression_00 != (ExprBase *)0x0) {
    Print(ctx,".set(%d, ",uVar2);
    Translate(ctx,expression_00);
    Print(ctx,")");
    uVar2 = (ulong)((int)uVar2 + 1);
    pIVar1 = (IntrusiveList<ExprBase> *)&expression_00->next;
  }
  return;
}

Assistant:

void TranslateArray(ExpressionTranslateContext &ctx, ExprArray *expression)
{
	TranslateTypeName(ctx, expression->type);
	Print(ctx, "()");

	unsigned index = 0;

	for(ExprBase *curr = expression->values.head; curr; curr = curr->next)
	{
		Print(ctx, ".set(%d, ", index);
		Translate(ctx, curr);
		Print(ctx, ")");

		index++;
	}
}